

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O3

int luaH_psetint(Table *t,lua_Integer key,TValue *val)

{
  TValue *io1;
  TValue *pTVar1;
  int iVar2;
  TValue *io2;
  
  pTVar1 = getintfromhash(t,key);
  if ((pTVar1->tt_ & 0xf) == 0) {
    iVar2 = 1;
    if (pTVar1->tt_ != 0x20) {
      iVar2 = (int)((ulong)((long)pTVar1 - (long)t->node) >> 3) * -0x55555555 + 3;
    }
  }
  else {
    pTVar1->value_ = val->value_;
    pTVar1->tt_ = val->tt_;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int luaH_psetint (Table *t, lua_Integer key, TValue *val) {
  lua_assert(!ikeyinarray(t, key));
  return finishnodeset(t, getintfromhash(t, key), val);
}